

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_0::comment
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_0 *this,string_view in)

{
  string_view in_00;
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  long local_a0;
  size_t depth;
  string_view local_78;
  size_t local_68;
  size_type size;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  anon_unknown_0 *local_40;
  char *local_38;
  undefined1 local_30 [8];
  LexCtx ctx;
  string_view in_local;
  
  local_38 = (char *)in._M_len;
  in_00._M_str = local_38;
  in_00._M_len = (size_t)this;
  local_40 = this;
  ctx.lexedSize = (size_t)this;
  LexCtx::LexCtx((LexCtx *)local_30,in_00);
  sVar2 = LexCtx::size((LexCtx *)local_30);
  if (sVar2 < 2) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
              (__return_storage_ptr__);
  }
  else {
    local_50 = sv(";;@",3);
    sVar2 = LexCtx::startsWith((LexCtx *)local_30,local_50);
    if (sVar2 == 0) {
      _size = sv(";;",2);
      bVar1 = LexCtx::takePrefix((LexCtx *)local_30,_size);
      if (bVar1) {
        local_78 = LexCtx::next((LexCtx *)local_30);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_78,'\n',0);
        local_68 = sVar3;
        sv("",0);
        if (sVar3 == 0xffffffffffffffff) {
          LexCtx::takeAll((LexCtx *)local_30);
        }
        else {
          LexCtx::take((LexCtx *)local_30,local_68);
        }
        LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
        return __return_storage_ptr__;
      }
    }
    bVar4 = sv("(;",2);
    bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
    if (bVar1) {
      local_a0 = 1;
      while( true ) {
        bVar1 = false;
        if (local_a0 != 0) {
          sVar2 = LexCtx::size((LexCtx *)local_30);
          bVar1 = 1 < sVar2;
        }
        if (!bVar1) break;
        bVar4 = sv("(;",2);
        bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
        if (bVar1) {
          local_a0 = local_a0 + 1;
        }
        else {
          bVar4 = sv(";)",2);
          bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
          if (bVar1) {
            local_a0 = local_a0 + -1;
          }
          else {
            LexCtx::take((LexCtx *)local_30,1);
          }
        }
      }
      if (local_a0 == 0) {
        LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
      }
      else {
        std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
                  (__return_storage_ptr__);
      }
    }
    else {
      std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> comment(std::string_view in) {
  LexCtx ctx(in);
  if (ctx.size() < 2) {
    return {};
  }

  // Line comment
  if (!ctx.startsWith(";;@"sv) && ctx.takePrefix(";;"sv)) {
    if (auto size = ctx.next().find('\n'); size != ""sv.npos) {
      ctx.take(size);
    } else {
      ctx.takeAll();
    }
    return ctx.lexed();
  }

  // Block comment (possibly nested!)
  if (ctx.takePrefix("(;"sv)) {
    size_t depth = 1;
    while (depth > 0 && ctx.size() >= 2) {
      if (ctx.takePrefix("(;"sv)) {
        ++depth;
      } else if (ctx.takePrefix(";)"sv)) {
        --depth;
      } else {
        ctx.take(1);
      }
    }
    if (depth > 0) {
      // TODO: Add error production for non-terminated block comment.
      return {};
    }
    return ctx.lexed();
  }

  return {};
}